

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O2

void __thiscall IntVarEL::setBLearnable(IntVarEL *this,bool b)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  
  for (iVar2 = this->lit_min; iVar2 <= this->lit_max + 1; iVar2 = iVar2 + 1) {
    uVar1 = (this->base_blit + -1) / 2 + iVar2;
    *(byte *)(sat.flags.data + uVar1) = *(byte *)(sat.flags.data + uVar1) & 0xfb | b * '\x04';
    uVar1 = (this->base_blit + -1) / 2 + iVar2;
    bVar3 = *(byte *)(sat.flags.data + uVar1) & 0xfc;
    if (b) {
      bVar3 = *(byte *)(sat.flags.data + uVar1) | 2;
    }
    *(byte *)(sat.flags.data + uVar1) = bVar3;
  }
  return;
}

Assistant:

void IntVarEL::setBLearnable(bool b) const {
	for (int i = lit_min; i <= lit_max + 1; i++) {
		sat.flags[(base_blit - 1) / 2 + i].setLearnable(b);
		sat.flags[(base_blit - 1) / 2 + i].setUIPable(b);
	}
}